

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

string * __thiscall
Database::Last_abi_cxx11_(string *__return_storage_ptr__,Database *this,Date *date)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  _Rb_tree_header *p_Var5;
  ostringstream fmt;
  char local_1a1;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if (((this->storage)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (bVar2 = Date::operator>((Date *)((this->storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_left + 1),date), bVar2)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"No entries","");
  }
  else {
    p_Var5 = &(this->storage)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = (this->storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var5->_M_header;
    for (; p_Var1 != (_Rb_tree_node_base *)0x0; p_Var1 = (&p_Var1->_M_left)[bVar2]) {
      bVar2 = Date::operator<((Date *)(p_Var1 + 1),date);
      if (!bVar2) {
        p_Var3 = p_Var1;
      }
    }
    if (((_Rb_tree_header *)p_Var3 == p_Var5) ||
       (bVar2 = Date::operator>((Date *)(p_Var3 + 1),date), bVar2)) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3);
    }
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar4 = operator<<((ostream *)local_1a0,(Date *)(p_Var3 + 1));
    local_1a1 = ' ';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_1a1,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,*(char **)(p_Var3[1]._M_right + -1),(long)p_Var3[1]._M_right[-1]._M_parent);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

string Database::Last(const Date& date) const {
    if (storage.empty() || storage.begin()->first > date) {
        return "No entries";
    }

    auto it = storage.lower_bound(date);
    if (it == storage.end() || it->first > date) {
        --it;
    }

    ostringstream fmt;
    fmt << it->first << ' ' << it->second.back();

    return fmt.str();
}